

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O3

EStatusCode __thiscall
PDFParser::ParseXrefFromXrefStream
          (PDFParser *this,XrefEntryInputVector *inXrefTable,ObjectIDType inXrefSize,
          PDFStreamInput *inXrefStream,ObjectIDType *outReadTableSize)

{
  ulong *puVar1;
  XrefEntryInputVector *pXVar2;
  EPDFObjectType EVar3;
  EStatusCode EVar4;
  PDFDictionary *pPVar5;
  PDFObject *pPVar6;
  unsigned_long uVar7;
  int *inEntryWidths;
  longlong lVar8;
  LongFilePositionType inOffsetFromStart;
  ObjectIDType inSegmentStartObject;
  ulong uVar9;
  Trace *pTVar10;
  PDFInteger *this_00;
  char *inFormat;
  ulong uVar11;
  PDFObjectCastPtr<PDFInteger> widthObject;
  PDFObjectCastPtr<PDFArray> wArray;
  RefCountPtr<PDFDictionary> streamDictionary;
  PDFObjectCastPtr<PDFArray> subsectionsIndex;
  PDFObjectCastPtr<PDFInteger> xrefSize;
  string local_b0;
  ulong local_90;
  RefCountPtr<PDFArray> local_88;
  IByteReader *local_78;
  ulong *local_70;
  XrefEntryInputVector *local_68;
  RefCountPtr<PDFDictionary> local_60;
  RefCountPtr<PDFArray> local_50;
  RefCountPtr<PDFInteger> local_40;
  
  *outReadTableSize = inXrefSize;
  local_90 = inXrefSize;
  local_78 = CreateInputStreamReader(this,inXrefStream);
  if (local_78 == (IByteReader *)0x0) {
    return eFailure;
  }
  pPVar5 = PDFStreamInput::QueryStreamDictionary(inXrefStream);
  local_60._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5810;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_60.mValue = pPVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"W","");
  pPVar6 = QueryDictionaryObject(this,pPVar5,&local_b0);
  local_88.mValue = PDFObjectCast<PDFArray>(pPVar6);
  local_88._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if (local_88.mValue == (PDFArray *)0x0) {
    pTVar10 = Trace::DefaultTrace();
    inEntryWidths = (int *)0x0;
    Trace::TraceToLog(pTVar10,"PDFParser::ParseXrefFromXrefStream, W array not available. failing");
LAB_001d7433:
    EVar4 = eFailure;
    goto LAB_001d757f;
  }
  local_70 = outReadTableSize;
  local_68 = inXrefTable;
  uVar7 = PDFArray::GetLength(local_88.mValue);
  inEntryWidths = (int *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 << 2);
  for (uVar11 = 0; uVar7 = PDFArray::GetLength(local_88.mValue), pPVar5 = local_60.mValue,
      uVar11 < uVar7; uVar11 = uVar11 + 1) {
    pPVar6 = PDFArray::QueryObject(local_88.mValue,uVar11);
    local_b0._M_string_length = (size_type)PDFObjectCast<PDFInteger>(pPVar6);
    local_b0._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a7140;
    if ((PDFInteger *)local_b0._M_string_length == (PDFInteger *)0x0) {
      pTVar10 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar10,
                        "PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)"
                       );
      RefCountPtr<PDFInteger>::~RefCountPtr((RefCountPtr<PDFInteger> *)&local_b0);
      goto LAB_001d7433;
    }
    lVar8 = PDFInteger::GetValue((PDFInteger *)local_b0._M_string_length);
    inEntryWidths[uVar11] = (int)lVar8;
    RefCountPtr<PDFInteger>::~RefCountPtr((RefCountPtr<PDFInteger> *)&local_b0);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Index","");
  pPVar6 = QueryDictionaryObject(this,pPVar5,&local_b0);
  local_50.mValue = PDFObjectCast<PDFArray>(pPVar6);
  local_50._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  inOffsetFromStart = PDFStreamInput::GetStreamContentStart(inXrefStream);
  InputOffsetStream::SetPosition(&this->mStream,inOffsetFromStart);
  PDFObjectParser::ResetReadState(&this->mObjectParser);
  pPVar5 = local_60.mValue;
  if (local_50.mValue == (PDFArray *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Size","");
    pPVar6 = QueryDictionaryObject(this,pPVar5,&local_b0);
    this_00 = PDFObjectCast<PDFInteger>(pPVar6);
    local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
    local_40.mValue = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    pXVar2 = local_68;
    puVar1 = local_70;
    if (this_00 == (PDFInteger *)0x0) {
      pTVar10 = Trace::DefaultTrace();
      EVar4 = eFailure;
      Trace::TraceToLog(pTVar10,
                        "PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream"
                       );
    }
    else {
      uVar11 = PDFInteger::GetValue(this_00);
      if (local_90 < uVar11) {
        EVar4 = eSuccess;
        if (this->mAllowExtendingSegments != true) goto LAB_001d752f;
        *puVar1 = uVar11;
      }
      uVar7 = PDFArray::GetLength(local_88.mValue);
      EVar4 = ReadXrefStreamSegment(this,pXVar2,0,uVar11,local_78,inEntryWidths,uVar7);
    }
LAB_001d752f:
    RefCountPtr<PDFInteger>::~RefCountPtr(&local_40);
  }
  else {
    PDFArray::GetIterator(local_50.mValue);
    pXVar2 = local_68;
    puVar1 = local_70;
    EVar4 = eSuccess;
    while ((pointer)local_b0.field_2._M_allocated_capacity != local_b0._M_dataplus._M_p) {
      if ((char)local_b0._M_string_length == '\x01') {
        local_b0._M_string_length = local_b0._M_string_length & 0xffffffffffffff00;
        if (EVar4 != eSuccess) break;
      }
      else {
        local_b0.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity + 8;
        if ((EVar4 != eSuccess) ||
           ((pointer)local_b0.field_2._M_allocated_capacity == local_b0._M_dataplus._M_p)) break;
      }
      EVar3 = PDFObject::GetType(*(PDFObject **)local_b0.field_2._M_allocated_capacity);
      if (EVar3 != ePDFObjectInteger) {
        pTVar10 = Trace::DefaultTrace();
        EVar4 = eFailure;
        Trace::TraceToLog(pTVar10,
                          "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
                         );
        break;
      }
      inSegmentStartObject =
           PDFInteger::GetValue(*(PDFInteger **)local_b0.field_2._M_allocated_capacity);
      if ((pointer)local_b0.field_2._M_allocated_capacity == local_b0._M_dataplus._M_p) {
LAB_001d7505:
        pTVar10 = Trace::DefaultTrace();
        inFormat = 
        "PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values"
        ;
LAB_001d7565:
        EVar4 = eFailure;
        Trace::TraceToLog(pTVar10,inFormat);
        break;
      }
      if ((char)local_b0._M_string_length == '\x01') {
        local_b0._M_string_length = local_b0._M_string_length & 0xffffffffffffff00;
      }
      else {
        local_b0.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity + 8;
        if ((pointer)local_b0.field_2._M_allocated_capacity == local_b0._M_dataplus._M_p)
        goto LAB_001d7505;
      }
      EVar3 = PDFObject::GetType(*(PDFObject **)local_b0.field_2._M_allocated_capacity);
      if (EVar3 != ePDFObjectInteger) {
        pTVar10 = Trace::DefaultTrace();
        inFormat = 
        "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream";
        goto LAB_001d7565;
      }
      uVar11 = PDFInteger::GetValue(*(PDFInteger **)local_b0.field_2._M_allocated_capacity);
      uVar9 = uVar11 + inSegmentStartObject;
      if (local_90 < uVar9) {
        if (this->mAllowExtendingSegments != true) {
          EVar4 = eSuccess;
          break;
        }
        *puVar1 = uVar9;
        local_90 = uVar9;
      }
      uVar7 = PDFArray::GetLength(local_88.mValue);
      uVar9 = local_90 - inSegmentStartObject;
      if (uVar11 <= local_90 - inSegmentStartObject) {
        uVar9 = uVar11;
      }
      EVar4 = ReadXrefStreamSegment
                        (this,pXVar2,inSegmentStartObject,uVar9,local_78,inEntryWidths,uVar7);
    }
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_50);
LAB_001d757f:
  RefCountPtr<PDFArray>::~RefCountPtr(&local_88);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_60);
  (*local_78->_vptr_IByteReader[1])();
  if (inEntryWidths != (int *)0x0) {
    operator_delete__(inEntryWidths);
  }
  return EVar4;
}

Assistant:

EStatusCode PDFParser::ParseXrefFromXrefStream(XrefEntryInputVector& inXrefTable,
                                                   ObjectIDType inXrefSize,
                                                   PDFStreamInput* inXrefStream,
                                                   ObjectIDType* outReadTableSize)
{
	// 1. Setup the stream to read from the stream start location
	// 2. Set it up with an input stream to decode if required
	// 3. if there are subsections, loop them, otherwise assume a single section of 0..size
	// 4. for each subsection use the base number as starting, and count as well, to read the stream entries to the right position in the table
	//    The entries are read using the "W" value. make sure to read even values that you don't need.

	EStatusCode status = PDFHummus::eSuccess;

    *outReadTableSize = inXrefSize;

	IByteReader* xrefStreamSource = CreateInputStreamReader(inXrefStream);
	int* widthsArray = NULL;

	do
	{
		if(!xrefStreamSource)
		{
			status = PDFHummus::eFailure;
			break;
		}

		RefCountPtr<PDFDictionary> streamDictionary(inXrefStream->QueryStreamDictionary());

		// setup w array
		PDFObjectCastPtr<PDFArray> wArray(QueryDictionaryObject(streamDictionary.GetPtr(),"W"));
		if(!wArray)
		{
			TRACE_LOG("PDFParser::ParseXrefFromXrefStream, W array not available. failing");
			status = PDFHummus::eFailure;
			break;
		}

		widthsArray = new int[wArray->GetLength()];
		for(unsigned long i=0;i <wArray->GetLength();++i)
		{
			PDFObjectCastPtr<PDFInteger> widthObject(wArray->QueryObject(i));
			if(!widthObject)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)");
				status = PDFHummus::eFailure;
				break;
			}
			widthsArray[i] = (int)widthObject->GetValue();
		}
		if(status != PDFHummus::eSuccess)
			break;

		// read the segments from the stream
		PDFObjectCastPtr<PDFArray> subsectionsIndex(QueryDictionaryObject(streamDictionary.GetPtr(),"Index"));
		MovePositionInStream(inXrefStream->GetStreamContentStart());

		if(!subsectionsIndex)
		{
			PDFObjectCastPtr<PDFInteger> xrefSize(QueryDictionaryObject(streamDictionary.GetPtr(),"Size"));
			if(!xrefSize)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream");
				status = PDFHummus::eFailure;
				break;
			}

            // if reading objects past expected range interesting consult policy
            ObjectIDType readXrefSize = (ObjectIDType)xrefSize->GetValue();

            if(readXrefSize > inXrefSize)
            {
                if(mAllowExtendingSegments)
                {
                    inXrefSize = readXrefSize;
                    *outReadTableSize = readXrefSize;
                }
                else
                    break;
            }
			status = ReadXrefStreamSegment(inXrefTable,0,readXrefSize,xrefStreamSource,widthsArray,wArray->GetLength());
		}
		else
		{
			SingleValueContainerIterator<PDFObjectVector> segmentsIterator  = subsectionsIndex->GetIterator();
			PDFInteger* segmentValue;
			while(segmentsIterator.MoveNext() && PDFHummus::eSuccess == status)
			{
				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType startObject = (ObjectIDType)segmentValue->GetValue();
				if(!segmentsIterator.MoveNext())
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values");
					status = PDFHummus::eFailure;
					break;
				}

				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType objectsCount = (ObjectIDType)segmentValue->GetValue();
				ObjectIDType readXrefSize = startObject +  objectsCount;

				// if reading objects past expected range interesting consult policy
				if(readXrefSize > inXrefSize)
                {
                    if(mAllowExtendingSegments)
                    {
                        inXrefSize = readXrefSize;
                        *outReadTableSize = readXrefSize;
                    }
                    else
                        break;
                }
				status = ReadXrefStreamSegment(inXrefTable,startObject,std::min<ObjectIDType>(objectsCount,inXrefSize - startObject),xrefStreamSource,widthsArray,wArray->GetLength());
			}
		}
	}while(false);

	delete xrefStreamSource;
	delete[] widthsArray;
	return status;
}